

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

int process_read_last_line(process_info_t *p,char *buffer,size_t buffer_len)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  
  iVar1 = fseek((FILE *)p->stdout_file,0,0);
  if (iVar1 < 0) {
    perror("fseek");
  }
  else {
    *buffer = '\0';
    pcVar2 = fgets(buffer,(int)buffer_len,(FILE *)p->stdout_file);
    while (pbVar3 = (byte *)buffer, pcVar2 != (char *)0x0) {
      while ((0xd < *pbVar3 || ((0x2401U >> (*pbVar3 & 0x1f) & 1) == 0))) {
        pbVar3 = pbVar3 + 1;
      }
      *pbVar3 = 0;
      pcVar2 = fgets(buffer,(int)buffer_len,(FILE *)p->stdout_file);
    }
    iVar1 = ferror((FILE *)p->stdout_file);
    if (iVar1 == 0) {
      return 0;
    }
    perror("read");
    *buffer = '\0';
  }
  return -1;
}

Assistant:

int process_read_last_line(process_info_t *p,
                           char* buffer,
                           size_t buffer_len) {
  char* ptr;

  int r = fseek(p->stdout_file, 0, SEEK_SET);
  if (r < 0) {
    perror("fseek");
    return -1;
  }

  buffer[0] = '\0';

  while (fgets(buffer, buffer_len, p->stdout_file) != NULL) {
    for (ptr = buffer; *ptr && *ptr != '\r' && *ptr != '\n'; ptr++)
      ;
    *ptr = '\0';
  }

  if (ferror(p->stdout_file)) {
    perror("read");
    buffer[0] = '\0';
    return -1;
  }
  return 0;
}